

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::add_function_overload(CompilerGLSL *this,SPIRFunction *func)

{
  bool bVar1;
  uint32_t uVar2;
  VectorView<spirv_cross::SPIRFunction::Parameter> *this_00;
  Parameter *pPVar3;
  SPIRType *pSVar4;
  pointer ppVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar8;
  key_type local_100;
  _Node_iterator_base<unsigned_long,_false> local_e0;
  undefined1 local_d8;
  _Node_iterator_base<unsigned_long,_false> local_d0;
  undefined1 local_c8;
  key_type local_c0;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_a0;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *overloads;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_true>
  local_80;
  iterator itr;
  string function_name;
  uint64_t types_hash;
  SPIRType *type;
  uint32_t type_id;
  Parameter *arg;
  Parameter *__end1;
  Parameter *__begin1;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *__range1;
  Hasher hasher;
  SPIRFunction *func_local;
  CompilerGLSL *this_local;
  
  hasher.h = (uint64_t)func;
  Hasher::Hasher((Hasher *)&__range1);
  this_00 = (VectorView<spirv_cross::SPIRFunction::Parameter> *)(hasher.h + 0x18);
  __end1 = VectorView<spirv_cross::SPIRFunction::Parameter>::begin(this_00);
  pPVar3 = VectorView<spirv_cross::SPIRFunction::Parameter>::end(this_00);
  for (; __end1 != pPVar3; __end1 = __end1 + 1) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
    type._4_4_ = Compiler::get_pointee_type_id(&this->super_Compiler,uVar2);
    pSVar4 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,type._4_4_);
    if (*(int *)&(pSVar4->super_IVariant).field_0xc == 0x1168) {
      pSVar4 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,type._4_4_);
      type._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar4->parent_type);
    }
    pSVar4 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,type._4_4_);
    bVar1 = VectorView<spirv_cross::CombinedImageSampler>::empty
                      (&(this->super_Compiler).combined_image_samplers.
                        super_VectorView<spirv_cross::CombinedImageSampler>);
    if ((bVar1) ||
       ((pSVar4->basetype != SampledImage &&
        (((pSVar4->basetype != Image || ((pSVar4->image).sampled != 1)) &&
         (pSVar4->basetype != Sampler)))))) {
      Hasher::u32((Hasher *)&__range1,type._4_4_);
    }
  }
  function_name.field_2._8_8_ = Hasher::get((Hasher *)&__range1);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(hasher.h + 8));
  (*(this->super_Compiler)._vptr_Compiler[6])((key_type *)&itr,this,(ulong)uVar2,1);
  local_80._M_cur =
       (__node_type *)
       ::std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
       ::find(&this->function_overloads,(key_type *)&itr);
  overloads = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *)::std::
                 end<std::unordered_map<std::__cxx11::string,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>>>>
                           (&this->function_overloads);
  bVar1 = ::std::__detail::operator!=
                    (&local_80,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_true>
                      *)&overloads);
  if (bVar1) {
    ppVar5 = ::std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false,_true>
                           *)&local_80);
    local_a0 = &ppVar5->second;
    sVar6 = ::std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::count(local_a0,(key_type *)(function_name.field_2._M_local_buf + 8));
    if (sVar6 == 0) {
      pVar8 = ::std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::insert(local_a0,(value_type *)(function_name.field_2._M_local_buf + 8));
      local_e0._M_cur =
           (__node_type *)pVar8.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
      local_d8 = pVar8.second;
    }
    else {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(hasher.h + 8));
      add_resource_name(this,uVar2);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(hasher.h + 8));
      (*(this->super_Compiler)._vptr_Compiler[6])(&local_c0,this,(ulong)uVar2,1);
      pmVar7 = ::std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
               ::operator[](&this->function_overloads,&local_c0);
      pVar8 = ::std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::insert(pmVar7,(value_type *)(function_name.field_2._M_local_buf + 8));
      local_d0._M_cur =
           (__node_type *)pVar8.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
      local_c8 = pVar8.second;
      ::std::__cxx11::string::~string((string *)&local_c0);
    }
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(hasher.h + 8));
    add_resource_name(this,uVar2);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(hasher.h + 8));
    (*(this->super_Compiler)._vptr_Compiler[6])(&local_100,this,(ulong)uVar2,1);
    pmVar7 = ::std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
             ::operator[](&this->function_overloads,&local_100);
    ::std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::insert(pmVar7,(value_type *)(function_name.field_2._M_local_buf + 8));
    ::std::__cxx11::string::~string((string *)&local_100);
  }
  ::std::__cxx11::string::~string((string *)&itr);
  return;
}

Assistant:

void CompilerGLSL::add_function_overload(const SPIRFunction &func)
{
	Hasher hasher;
	for (auto &arg : func.arguments)
	{
		// Parameters can vary with pointer type or not,
		// but that will not change the signature in GLSL/HLSL,
		// so strip the pointer type before hashing.
		uint32_t type_id = get_pointee_type_id(arg.type);

		// Workaround glslang bug. It seems to only consider the base type when resolving overloads.
		if (get<SPIRType>(type_id).op == spv::OpTypeCooperativeMatrixKHR)
			type_id = get<SPIRType>(type_id).parent_type;

		auto &type = get<SPIRType>(type_id);

		if (!combined_image_samplers.empty())
		{
			// If we have combined image samplers, we cannot really trust the image and sampler arguments
			// we pass down to callees, because they may be shuffled around.
			// Ignore these arguments, to make sure that functions need to differ in some other way
			// to be considered different overloads.
			if (type.basetype == SPIRType::SampledImage ||
			    (type.basetype == SPIRType::Image && type.image.sampled == 1) || type.basetype == SPIRType::Sampler)
			{
				continue;
			}
		}

		hasher.u32(type_id);
	}
	uint64_t types_hash = hasher.get();

	auto function_name = to_name(func.self);
	auto itr = function_overloads.find(function_name);
	if (itr != end(function_overloads))
	{
		// There exists a function with this name already.
		auto &overloads = itr->second;
		if (overloads.count(types_hash) != 0)
		{
			// Overload conflict, assign a new name.
			add_resource_name(func.self);
			function_overloads[to_name(func.self)].insert(types_hash);
		}
		else
		{
			// Can reuse the name.
			overloads.insert(types_hash);
		}
	}
	else
	{
		// First time we see this function name.
		add_resource_name(func.self);
		function_overloads[to_name(func.self)].insert(types_hash);
	}
}